

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doc_comment.cc
# Opt level: O0

void google::protobuf::compiler::java::WriteFieldStringBytesAccessorDocComment
               (Printer *printer,FieldDescriptor *field,FieldAccessorType type,Options *options,
               bool builder,bool kdoc)

{
  FieldAccessorType type_00;
  FieldDescriptor *pFVar1;
  FieldDescriptor *pFVar2;
  DescriptorStringView psVar3;
  undefined1 kdoc_00;
  Printer *pPVar4;
  string_view local_1f0;
  string_view local_1e0;
  string_view local_1d0;
  string_view local_1c0;
  string_view local_1b0;
  string_view local_1a0;
  string_view local_190;
  string_view local_180;
  string_view local_170;
  string_view local_160;
  string_view local_150;
  Options local_140;
  Options local_f0;
  Options local_90;
  string_view local_40;
  byte local_2a;
  byte local_29;
  bool kdoc_local;
  Options *pOStack_28;
  bool builder_local;
  Options *options_local;
  FieldDescriptor *pFStack_18;
  FieldAccessorType type_local;
  FieldDescriptor *field_local;
  Printer *printer_local;
  
  pPVar4 = printer;
  local_2a = kdoc;
  local_29 = builder;
  pOStack_28 = options;
  options_local._4_4_ = type;
  pFStack_18 = field;
  field_local = (FieldDescriptor *)printer;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,"/**\n");
  kdoc_00 = SUB81(pPVar4,0);
  io::Printer::Print<>(printer,local_40);
  pFVar1 = field_local;
  pPVar4 = (Printer *)pFStack_18;
  Options::Options(&local_90,options);
  WriteDocCommentBody<google::protobuf::FieldDescriptor>
            ((java *)pFVar1,pPVar4,(FieldDescriptor *)&local_90,(Options *)(ulong)(local_2a & 1),
             (bool)kdoc_00);
  Options::~Options(&local_90);
  pFVar2 = field_local;
  pFVar1 = pFStack_18;
  Options::Options(&local_f0,options);
  WriteDebugString((Printer *)pFVar2,pFVar1,&local_f0,(bool)(local_2a & 1));
  Options::~Options(&local_f0);
  pFVar2 = field_local;
  pFVar1 = pFStack_18;
  type_00 = options_local._4_4_;
  if ((local_2a & 1) == 0) {
    Options::Options(&local_140,options);
    WriteDeprecatedJavadoc((Printer *)pFVar2,pFVar1,type_00,&local_140);
    Options::~Options(&local_140);
  }
  pFVar1 = field_local;
  switch(options_local._4_4_) {
  case HAZZER:
    break;
  case GETTER:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_150," * @return The bytes for $name$.\n");
    psVar3 = FieldDescriptor::camelcase_name_abi_cxx11_(pFStack_18);
    io::Printer::Print<char[5],std::__cxx11::string>
              ((Printer *)pFVar1,local_150,(char (*) [5])0x6b980f,psVar3);
    break;
  case SETTER:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_160," * @param value The bytes for $name$ to set.\n");
    psVar3 = FieldDescriptor::camelcase_name_abi_cxx11_(pFStack_18);
    io::Printer::Print<char[5],std::__cxx11::string>
              ((Printer *)pFVar1,local_160,(char (*) [5])0x6b980f,psVar3);
    break;
  case CLEARER:
    break;
  case LIST_COUNT:
    break;
  case LIST_GETTER:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_170," * @return A list containing the bytes for $name$.\n");
    psVar3 = FieldDescriptor::camelcase_name_abi_cxx11_(pFStack_18);
    io::Printer::Print<char[5],std::__cxx11::string>
              ((Printer *)pFVar1,local_170,(char (*) [5])0x6b980f,psVar3);
    break;
  case LIST_INDEXED_GETTER:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_180," * @param index The index of the value to return.\n");
    io::Printer::Print<>((Printer *)pFVar1,local_180);
    pFVar1 = field_local;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_190," * @return The bytes of the $name$ at the given index.\n");
    psVar3 = FieldDescriptor::camelcase_name_abi_cxx11_(pFStack_18);
    io::Printer::Print<char[5],std::__cxx11::string>
              ((Printer *)pFVar1,local_190,(char (*) [5])0x6b980f,psVar3);
    break;
  case LIST_INDEXED_SETTER:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1a0," * @param index The index to set the value at.\n");
    io::Printer::Print<>((Printer *)pFVar1,local_1a0);
    pFVar1 = field_local;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1b0," * @param value The bytes of the $name$ to set.\n");
    psVar3 = FieldDescriptor::camelcase_name_abi_cxx11_(pFStack_18);
    io::Printer::Print<char[5],std::__cxx11::string>
              ((Printer *)pFVar1,local_1b0,(char (*) [5])0x6b980f,psVar3);
    break;
  case LIST_ADDER:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1c0," * @param value The bytes of the $name$ to add.\n");
    psVar3 = FieldDescriptor::camelcase_name_abi_cxx11_(pFStack_18);
    io::Printer::Print<char[5],std::__cxx11::string>
              ((Printer *)pFVar1,local_1c0,(char (*) [5])0x6b980f,psVar3);
    break;
  case LIST_MULTI_ADDER:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1d0," * @param values The bytes of the $name$ to add.\n");
    psVar3 = FieldDescriptor::camelcase_name_abi_cxx11_(pFStack_18);
    io::Printer::Print<char[5],std::__cxx11::string>
              ((Printer *)pFVar1,local_1d0,(char (*) [5])0x6b980f,psVar3);
  }
  pFVar1 = field_local;
  if ((local_29 & 1) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1e0," * @return This builder for chaining.\n");
    io::Printer::Print<>((Printer *)pFVar1,local_1e0);
  }
  pFVar1 = field_local;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1f0," */\n");
  io::Printer::Print<>((Printer *)pFVar1,local_1f0);
  return;
}

Assistant:

void WriteFieldStringBytesAccessorDocComment(io::Printer* printer,
                                             const FieldDescriptor* field,
                                             const FieldAccessorType type,
                                             const Options options,
                                             const bool builder,
                                             const bool kdoc) {
  printer->Print("/**\n");
  WriteDocCommentBody(printer, field, options, kdoc);
  WriteDebugString(printer, field, options, kdoc);
  if (!kdoc) WriteDeprecatedJavadoc(printer, field, type, options);
  switch (type) {
    case HAZZER:
      // Should never happen
      break;
    case GETTER:
      printer->Print(" * @return The bytes for $name$.\n", "name",
                     field->camelcase_name());
      break;
    case SETTER:
      printer->Print(" * @param value The bytes for $name$ to set.\n", "name",
                     field->camelcase_name());
      break;
    case CLEARER:
      // Print nothing
      break;
    // Repeated
    case LIST_COUNT:
      // Should never happen
      break;
    case LIST_GETTER:
      printer->Print(" * @return A list containing the bytes for $name$.\n",
                     "name", field->camelcase_name());
      break;
    case LIST_INDEXED_GETTER:
      printer->Print(" * @param index The index of the value to return.\n");
      printer->Print(" * @return The bytes of the $name$ at the given index.\n",
                     "name", field->camelcase_name());
      break;
    case LIST_INDEXED_SETTER:
      printer->Print(" * @param index The index to set the value at.\n");
      printer->Print(" * @param value The bytes of the $name$ to set.\n",
                     "name", field->camelcase_name());
      break;
    case LIST_ADDER:
      printer->Print(" * @param value The bytes of the $name$ to add.\n",
                     "name", field->camelcase_name());
      break;
    case LIST_MULTI_ADDER:
      printer->Print(" * @param values The bytes of the $name$ to add.\n",
                     "name", field->camelcase_name());
      break;
  }
  if (builder) {
    printer->Print(" * @return This builder for chaining.\n");
  }
  printer->Print(" */\n");
}